

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

void Curl_flush_cookies(Curl_easy *data,int cleanup)

{
  CookieInfo *cookies;
  curl_slist *list;
  int iVar1;
  FILE *__stream;
  void *__base;
  long lVar2;
  char *pcVar3;
  Cookie *pCVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((data->set).str[5] == (char *)0x0) {
    if ((cleanup != 0) && (list = (data->change).cookielist, list != (curl_slist *)0x0)) {
      curl_slist_free_all(list);
      (data->change).cookielist = (curl_slist *)0x0;
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    goto LAB_004be0a5;
  }
  if ((data->change).cookielist != (curl_slist *)0x0) {
    Curl_cookie_loadfiles(data);
  }
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  cookies = data->cookies;
  if (cookies == (CookieInfo *)0x0) goto LAB_004be0a5;
  pcVar3 = (data->set).str[5];
  remove_expired(cookies);
  iVar1 = strcmp("-",pcVar3);
  __stream = _stdout;
  if ((iVar1 == 0) || (__stream = fopen64(pcVar3,"w"), __stream != (FILE *)0x0)) {
    fputs("# Netscape HTTP Cookie File\n# https://curl.haxx.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
          ,__stream);
    if (cookies->numcookies != 0) {
      __base = (*Curl_cmalloc)(cookies->numcookies << 3);
      if (__base == (void *)0x0) {
        if (iVar1 != 0) {
          fclose(__stream);
        }
        goto LAB_004be089;
      }
      lVar2 = 0;
      uVar6 = 0;
      do {
        for (pCVar4 = cookies->cookies[lVar2]; pCVar4 != (Cookie *)0x0; pCVar4 = pCVar4->next) {
          uVar5 = uVar6;
          if (pCVar4->domain != (char *)0x0) {
            uVar5 = (ulong)((int)uVar6 + 1);
            *(Cookie **)((long)__base + uVar6 * 8) = pCVar4;
          }
          uVar6 = uVar5;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x100);
      qsort(__base,cookies->numcookies,8,cookie_sort_ct);
      if ((int)uVar6 != 0) {
        uVar5 = 0;
        do {
          pcVar3 = get_netscape_format(*(Cookie **)((long)__base + uVar5 * 8));
          if (pcVar3 == (char *)0x0) {
            curl_mfprintf((FILE *)__stream,"#\n# Fatal libcurl error\n");
            (*Curl_cfree)(__base);
            if (iVar1 != 0) {
              fclose(__stream);
            }
          }
          else {
            curl_mfprintf((FILE *)__stream,"%s\n",pcVar3);
            (*Curl_cfree)(pcVar3);
          }
          if (pcVar3 == (char *)0x0) goto LAB_004be089;
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
      (*Curl_cfree)(__base);
    }
    if (iVar1 != 0) {
      fclose(__stream);
    }
  }
  else {
LAB_004be089:
    Curl_infof(data,"WARNING: failed to save cookies in %s\n",(data->set).str[5]);
  }
LAB_004be0a5:
  if ((cleanup != 0) &&
     ((data->share == (Curl_share *)0x0 || (data->cookies != data->share->cookies)))) {
    Curl_cookie_cleanup(data->cookies);
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, int cleanup)
{
  if(data->set.str[STRING_COOKIEJAR]) {
    if(data->change.cookielist) {
      /* If there is a list of cookie files to read, do it first so that
         we have all the told files read before we write the new jar.
         Curl_cookie_loadfiles() LOCKS and UNLOCKS the share itself! */
      Curl_cookie_loadfiles(data);
    }

    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    if(cookie_output(data->cookies, data->set.str[STRING_COOKIEJAR]))
      infof(data, "WARNING: failed to save cookies in %s\n",
            data->set.str[STRING_COOKIEJAR]);
  }
  else {
    if(cleanup && data->change.cookielist) {
      /* since nothing is written, we can just free the list of cookie file
         names */
      curl_slist_free_all(data->change.cookielist); /* clean up list */
      data->change.cookielist = NULL;
    }
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}